

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testThreads.c
# Opt level: O1

int main(void)

{
  char *__s1;
  undefined8 uVar1;
  int iVar2;
  uint *puVar3;
  undefined8 *puVar4;
  int *piVar5;
  long *plVar6;
  int iVar7;
  pthread_t *__newthread;
  long lVar8;
  xmlThreadParams *__arg;
  ulong uVar9;
  uint uVar10;
  void *result;
  void *pvStack_38;
  
  xmlInitParser();
  iVar7 = 0;
  do {
    xmlLoadCatalog("test/threads/complex.xml");
    tid[0]._0_4_ = 0xffffffff;
    tid[0]._4_4_ = 0xffffffff;
    tid[1]._0_4_ = 0xffffffff;
    tid[1]._4_4_ = 0xffffffff;
    tid[2]._0_4_ = 0xffffffff;
    tid[2]._4_4_ = 0xffffffff;
    tid[3]._0_4_ = 0xffffffff;
    tid[3]._4_4_ = 0xffffffff;
    tid[4]._0_4_ = 0xffffffff;
    tid[4]._4_4_ = 0xffffffff;
    tid[5]._0_4_ = 0xffffffff;
    tid[5]._4_4_ = 0xffffffff;
    tid[6] = 0xffffffffffffffff;
    __arg = threadParams;
    lVar8 = 0;
    do {
      __newthread = (pthread_t *)((long)tid + lVar8);
      iVar2 = pthread_create(__newthread,(pthread_attr_t *)0x0,thread_specific_data,__arg);
      if (iVar2 != 0) {
        main_cold_1();
        goto LAB_00101367;
      }
      lVar8 = lVar8 + 8;
      __arg = __arg + 1;
    } while (lVar8 != 0x38);
    lVar8 = 0;
    do {
      __newthread = *(pthread_t **)((long)tid + lVar8);
      iVar2 = pthread_join((pthread_t)__newthread,&pvStack_38);
      if (iVar2 != 0) {
LAB_00101367:
        main_cold_2();
        __s1 = (char *)*__newthread;
        iVar7 = strcmp(__s1,"test/threads/invalid.xml");
        puVar3 = (uint *)__xmlDoValidityCheckingDefaultValue();
        *puVar3 = (uint)(iVar7 != 0);
        if (iVar7 == 0) {
          puVar4 = (undefined8 *)&stdout;
        }
        else {
          puVar4 = (undefined8 *)&stderr;
        }
        uVar1 = *puVar4;
        puVar4 = (undefined8 *)__xmlGenericErrorContext();
        *puVar4 = uVar1;
        lVar8 = xmlParseFile(__s1);
        if (lVar8 == 0) {
          puts("parse failed");
        }
        else {
          xmlFreeDoc(lVar8);
        }
        uVar10 = (uint)(lVar8 != 0);
        iVar7 = strcmp(__s1,"test/threads/invalid.xml");
        piVar5 = (int *)__xmlDoValidityCheckingDefaultValue();
        if (iVar7 == 0) {
          if (*piVar5 != 0) {
            puts("ValidityCheckingDefaultValue override failed");
            uVar10 = 0;
          }
          plVar6 = (long *)__xmlGenericErrorContext();
          lVar8 = *plVar6;
          plVar6 = (long *)&stdout;
        }
        else {
          if (*piVar5 != 1) {
            puts("ValidityCheckingDefaultValue override failed");
            uVar10 = 0;
          }
          plVar6 = (long *)__xmlGenericErrorContext();
          lVar8 = *plVar6;
          plVar6 = (long *)&stderr;
        }
        if (lVar8 != *plVar6) {
          puts("xmlGenericErrorContext override failed");
          uVar10 = 0;
        }
        *(uint *)(__newthread + 1) = uVar10;
        return 0;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x38);
    xmlCatalogCleanup();
    piVar5 = &threadParams[0].okay;
    uVar9 = 0;
    do {
      if (*piVar5 == 0) {
        printf("Thread %d handling %s failed\n",uVar9 & 0xffffffff,
               ((xmlThreadParams *)(piVar5 + -2))->filename);
      }
      uVar9 = uVar9 + 1;
      piVar5 = piVar5 + 4;
    } while (uVar9 != 7);
    iVar7 = iVar7 + 1;
    if (iVar7 == 500) {
      xmlCleanupParser();
      xmlMemoryDump();
      return 0;
    }
  } while( true );
}

Assistant:

int
main(void)
{
    unsigned int i, repeat;
    int ret;

    xmlInitParser();
    for (repeat = 0;repeat < TEST_REPEAT_COUNT;repeat++) {
	xmlLoadCatalog(catalog);

        memset(tid, 0xff, sizeof(*tid)*num_threads);

	for (i = 0; i < num_threads; i++) {
	    ret = pthread_create(&tid[i], NULL, thread_specific_data,
				 (void *) &threadParams[i]);
	    if (ret != 0) {
		perror("pthread_create");
		exit(1);
	    }
	}
	for (i = 0; i < num_threads; i++) {
            void *result;
	    ret = pthread_join(tid[i], &result);
	    if (ret != 0) {
		perror("pthread_join");
		exit(1);
	    }
	}

	xmlCatalogCleanup();
	for (i = 0; i < num_threads; i++)
	    if (threadParams[i].okay == 0)
		printf("Thread %d handling %s failed\n", i,
                       threadParams[i].filename);
    }
    xmlCleanupParser();
    xmlMemoryDump();
    return (0);
}